

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-face.c
# Opt level: O0

ndn_unix_face_t * ndn_unix_face_construct(char *addr,_Bool client)

{
  int iVar1;
  int iret;
  ndn_unix_face_t *ret;
  _Bool client_local;
  char *addr_local;
  
  addr_local = (char *)malloc(0x10b0);
  if ((ndn_face_intf_t *)addr_local == (ndn_face_intf_t *)0x0) {
    addr_local = (char *)0x0;
  }
  else {
    ((ndn_face_intf_t *)addr_local)->face_id = 0xffff;
    iVar1 = ndn_forwarder_register_face((ndn_face_intf_t *)addr_local);
    if (iVar1 == 0) {
      ((ndn_face_intf_t *)addr_local)->type = '\x01';
      ((ndn_face_intf_t *)addr_local)->state = '\0';
      if (client) {
        ((ndn_face_intf_t *)addr_local)->up = ndn_unix_client_face_up;
      }
      else {
        ((ndn_face_intf_t *)addr_local)->up = ndn_unix_server_face_up;
      }
      ((ndn_face_intf_t *)addr_local)->down = ndn_unix_face_down;
      ((ndn_face_intf_t *)addr_local)->send = ndn_unix_face_send;
      ((ndn_face_intf_t *)addr_local)->destroy = ndn_unix_face_destroy;
      *(undefined2 *)&((ndn_face_intf_t *)((long)addr_local + 0x28))->up = 1;
      if (*addr == '\0') {
        *(undefined1 *)((long)&((ndn_face_intf_t *)((long)addr_local + 0x28))->up + 2) = 0;
        strncpy((char *)((long)&((ndn_face_intf_t *)((long)addr_local + 0x28))->up + 3),addr + 1,
                0x6a);
      }
      else {
        strncpy((char *)((long)&((ndn_face_intf_t *)((long)addr_local + 0x28))->up + 2),addr,0x6b);
      }
      *(_Bool *)&((ndn_face_intf_t *)((long)addr_local + 0x1090))->destroy = client;
      *(undefined4 *)&((ndn_face_intf_t *)((long)addr_local + 0xa0))->up = 0xffffffff;
      *(undefined4 *)((long)&((ndn_face_intf_t *)((long)addr_local + 0x1090))->down + 4) = 0;
      ((ndn_face_intf_t *)((long)addr_local + 0x78))->face_id = 0;
      ((ndn_face_intf_t *)((long)addr_local + 0x78))->state = '\0';
      ((ndn_face_intf_t *)((long)addr_local + 0x78))->type = '\0';
      *(undefined4 *)&((ndn_face_intf_t *)((long)addr_local + 0x78))->field_0x24 = 0;
      ndn_face_up((ndn_face_intf_t *)addr_local);
    }
    else {
      free(addr_local);
      addr_local = (char *)0x0;
    }
  }
  return (ndn_unix_face_t *)addr_local;
}

Assistant:

ndn_unix_face_t*
ndn_unix_face_construct(const char* addr, bool client){
  ndn_unix_face_t* ret;
  int iret;

  ret = (ndn_unix_face_t*)malloc(sizeof(ndn_unix_face_t));
  if(!ret){
    return NULL;
  }

  ret->intf.face_id = NDN_INVALID_ID;
  iret = ndn_forwarder_register_face(&ret->intf);
  if(iret != NDN_SUCCESS){
    free(ret);
    return NULL;
  }

  ret->intf.type = NDN_FACE_TYPE_APP;
  ret->intf.state = NDN_FACE_STATE_DOWN;
  if(client){
    ret->intf.up = ndn_unix_client_face_up;
  }else{
    ret->intf.up = ndn_unix_server_face_up;
  }
  ret->intf.down = ndn_unix_face_down;
  ret->intf.send = ndn_unix_face_send;
  ret->intf.destroy = ndn_unix_face_destroy;

  ret->addr.sun_family = AF_UNIX;
  if (addr[0] == '\0') {
    // Hidden path
    ret->addr.sun_path[0] = '\0';
    strncpy(ret->addr.sun_path + 1, addr + 1, sizeof(ret->addr.sun_path) - 2);
  } else {
    strncpy(ret->addr.sun_path, addr, sizeof(ret->addr.sun_path) - 1);
  }

  ret->client = client;
  ret->sock = -1;
  ret->offset = 0;
  ret->process_event = NULL;
  ndn_face_up(&ret->intf);

  return ret;
}